

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_fcaddd_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  float64 fVar4;
  float64 fVar5;
  ulong uVar6;
  ulong uVar7;
  uintptr_t i;
  ulong uVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = uVar1 + 8;
  uVar3 = (ulong)uVar2;
  uVar7 = 0;
  do {
    fVar5 = *(float64 *)((long)vn + uVar7 * 8 + 8);
    uVar6 = *(ulong *)((long)vm + uVar7 * 8);
    fVar4 = float64_add_arm(*(float64 *)((long)vn + uVar7 * 8),
                            *(ulong *)((long)vm + uVar7 * 8 + 8) ^ (ulong)~(desc >> 10) << 0x3f,
                            (float_status *)vfpst);
    *(float64 *)((long)vd + uVar7 * 8) = fVar4;
    fVar5 = float64_add_arm(fVar5,uVar6 ^ (ulong)(desc >> 10) << 0x3f,(float_status *)vfpst);
    *(float64 *)((long)vd + uVar7 * 8 + 8) = fVar5;
    uVar7 = uVar7 + 2;
  } while (uVar7 < uVar2 >> 3);
  uVar2 = desc >> 2 & 0xf8;
  if (uVar1 < uVar2) {
    uVar6 = (ulong)(uVar2 + 8);
    uVar7 = uVar3 + 8;
    if (uVar3 + 8 < uVar6) {
      uVar7 = uVar6;
    }
    memset((void *)((long)vd + uVar3),0,(~uVar3 + uVar7 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_fcaddd)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float64 *d = vd;
    float64 *n = vn;
    float64 *m = vm;
    float_status *fpst = vfpst;
    uint64_t neg_real = extract64(desc, SIMD_DATA_SHIFT, 1);
    uint64_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 63;
    neg_imag <<= 63;

    for (i = 0; i < opr_sz / 8; i += 2) {
        float64 e0 = n[i];
        float64 e1 = m[i + 1] ^ neg_imag;
        float64 e2 = n[i + 1];
        float64 e3 = m[i] ^ neg_real;

        d[i] = float64_add(e0, e1, fpst);
        d[i + 1] = float64_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}